

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O2

bool FastPForLib::Simple16<true>::trymefull<7u,2u,14u,1u>(uint32_t *n)

{
  uint *puVar1;
  long lVar2;
  uint32_t i;
  bool bVar3;
  
  _i = 0;
  while (_i != 7) {
    puVar1 = n + _i;
    _i = _i + 1;
    if (3 < *puVar1) {
      return false;
    }
  }
  _i = 0;
  do {
    bVar3 = _i == 0xe;
    if (bVar3) {
      return bVar3;
    }
    lVar2 = _i + 7;
    _i = _i + 1;
  } while (n[lVar2] < 2);
  return bVar3;
}

Assistant:

__attribute__((pure)) static bool trymefull(const uint32_t *n) {
    const uint32_t min1 = num1;
    for (uint32_t i = 0; i < min1; i++) {
      if (n[i] >= (1U << log1))
        return false;
    }
    const uint32_t min2 = num2;
    for (uint32_t i = min1; i < min1 + min2; i++) {
      if (n[i] >= (1U << log2))
        return false;
    }
    return true;
  }